

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md_parser.cpp
# Opt level: O0

string * anon_unknown.dwarf_4bca7::string_clear_leading
                   (string *__return_storage_ptr__,string *s,string *subset)

{
  allocator<char> local_29;
  long local_28;
  size_t found;
  string *subset_local;
  string *s_local;
  
  found = (size_t)subset;
  subset_local = s;
  s_local = __return_storage_ptr__;
  local_28 = std::__cxx11::string::find_first_not_of((string *)s,(ulong)subset);
  if (local_28 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_29);
    std::allocator<char>::~allocator(&local_29);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)subset_local);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string string_clear_leading(const std::string & s, const std::string & subset) {
		size_t found = s.find_first_not_of(subset);
		if (found != string::npos) {
			return s.substr(found);
		} else {
			return string("");
		}
	}